

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.hpp
# Opt level: O3

void __thiscall helics::FilterInfo::~FilterInfo(FilterInfo *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pGVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pcVar1 = (this->destEpts)._M_dataplus._M_p;
  paVar3 = &(this->destEpts).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->sourceEpts)._M_dataplus._M_p;
  paVar3 = &(this->sourceEpts).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::~vector
            (&this->destEndpoints);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::~vector
            (&this->sourceEndpoints);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pGVar2 = (this->destTargets).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pGVar2 != (pointer)0x0) {
    operator_delete(pGVar2,(long)(this->destTargets).
                                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar2);
  }
  pGVar2 = (this->sourceTargets).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pGVar2 != (pointer)0x0) {
    operator_delete(pGVar2,(long)(this->sourceTargets).
                                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar2);
  }
  pcVar1 = (this->outputType)._M_dataplus._M_p;
  paVar3 = &(this->outputType).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->inputType)._M_dataplus._M_p;
  paVar3 = &(this->inputType).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->key)._M_dataplus._M_p;
  paVar3 = &(this->key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

FilterInfo(GlobalBrokerId core_id_,
               InterfaceHandle handle_,
               std::string_view key_,
               std::string_view type_in_,
               std::string_view type_out_,
               bool destFilter_):
        core_id(core_id_), handle(handle_), key(key_), inputType(type_in_), outputType(type_out_),
        dest_filter(destFilter_)
    {
    }